

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O1

UBool __thiscall icu_63::UVector32::containsAll(UVector32 *this,UVector32 *other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = (ulong)other->count;
  bVar4 = (long)uVar1 < 1;
  if (0 < (long)uVar1) {
    uVar2 = 0;
    while (0 < this->count) {
      uVar3 = 0;
      while (this->elements[uVar3] != other->elements[uVar2]) {
        uVar3 = uVar3 + 1;
        if ((uint)this->count == uVar3) {
          return bVar4;
        }
      }
      uVar2 = uVar2 + 1;
      bVar4 = uVar1 <= uVar2;
      if (uVar2 == uVar1) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

UBool UVector32::containsAll(const UVector32& other) const {
    for (int32_t i=0; i<other.size(); ++i) {
        if (indexOf(other.elements[i]) < 0) {
            return FALSE;
        }
    }
    return TRUE;
}